

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.cpp
# Opt level: O0

void pbrt::createFilm(SP *ours,SP *pbrt)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  element_type *peVar4;
  element_type *peVar5;
  ostream *this;
  string fileName;
  vec2i resolution;
  undefined4 in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdac;
  ParamArray<int> *in_stack_fffffffffffffdb0;
  ParamArray<int> *this_00;
  string *in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdc0;
  undefined4 in_stack_fffffffffffffdc4;
  string *in_stack_fffffffffffffdd0;
  string *name;
  vec2i *in_stack_fffffffffffffdd8;
  allocator<char> *in_stack_fffffffffffffde0;
  undefined7 in_stack_fffffffffffffde8;
  undefined1 in_stack_fffffffffffffdef;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  bool local_1b1;
  allocator<char> local_199;
  string local_198 [55];
  allocator<char> local_161;
  string local_160 [16];
  undefined8 in_stack_fffffffffffffeb0;
  ParamSet *in_stack_fffffffffffffeb8;
  allocator<char> local_129;
  string local_128 [32];
  string local_108 [39];
  allocator<char> local_e1;
  string local_e0 [39];
  allocator<char> local_b9;
  string local_b8 [36];
  int local_94;
  int local_90;
  byte local_8c;
  byte local_8b;
  byte local_8a;
  allocator<char> local_89;
  string local_88 [32];
  __shared_ptr local_68 [18];
  byte local_56;
  byte local_55;
  byte local_42;
  allocator<char> local_41;
  string local_40 [32];
  __shared_ptr local_20 [32];
  
  peVar4 = std::
           __shared_ptr_access<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1a94df);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&peVar4->film);
  local_42 = 0;
  local_55 = 0;
  local_56 = 0;
  local_8a = 0;
  local_8b = 0;
  local_8c = 0;
  local_1b1 = false;
  if (bVar1) {
    std::__shared_ptr_access<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1a953d);
    std::__shared_ptr_access<pbrt::syntactic::Film,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<pbrt::syntactic::Film,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1a9549);
    std::allocator<char>::allocator();
    local_42 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffdf0,
               (char *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8),
               in_stack_fffffffffffffde0);
    local_55 = 1;
    syntactic::ParamSet::findParam<int>
              ((ParamSet *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
    local_56 = 1;
    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_20);
    local_1b1 = false;
    if (bVar1) {
      std::__shared_ptr_access<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1a95e8);
      std::__shared_ptr_access<pbrt::syntactic::Film,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<pbrt::syntactic::Film,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1a95f4);
      std::allocator<char>::allocator();
      local_8a = 1;
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffdf0,
                 (char *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8),
                 in_stack_fffffffffffffde0);
      local_8b = 1;
      syntactic::ParamSet::findParam<int>
                ((ParamSet *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
      local_8c = 1;
      local_1b1 = std::__shared_ptr::operator_cast_to_bool(local_68);
    }
  }
  if ((local_8c & 1) != 0) {
    std::shared_ptr<pbrt::syntactic::ParamArray<int>_>::~shared_ptr
              ((shared_ptr<pbrt::syntactic::ParamArray<int>_> *)0x1a9696);
  }
  if ((local_8b & 1) != 0) {
    std::__cxx11::string::~string(local_88);
  }
  if ((local_8a & 1) != 0) {
    std::allocator<char>::~allocator(&local_89);
  }
  if ((local_56 & 1) != 0) {
    std::shared_ptr<pbrt::syntactic::ParamArray<int>_>::~shared_ptr
              ((shared_ptr<pbrt::syntactic::ParamArray<int>_> *)0x1a96e1);
  }
  if ((local_55 & 1) != 0) {
    std::__cxx11::string::~string(local_40);
  }
  if ((local_42 & 1) != 0) {
    std::allocator<char>::~allocator(&local_41);
  }
  if (local_1b1 == false) {
    this = std::operator<<((ostream *)&std::cout,
                           "warning: could not determine film resolution from pbrt scene");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffdf0,
               (char *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8),
               in_stack_fffffffffffffde0);
    std::allocator<char>::~allocator(&local_b9);
    std::__shared_ptr_access<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1a9767);
    peVar5 = std::
             __shared_ptr_access<pbrt::syntactic::Film,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<pbrt::syntactic::Film,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1a9773);
    this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &(peVar5->super_Node).super_ParamSet;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_01,(char *)CONCAT17(in_stack_fffffffffffffdef,in_stack_fffffffffffffde8),
               in_stack_fffffffffffffde0);
    bVar2 = syntactic::ParamSet::hasParamString
                      ((ParamSet *)CONCAT44(in_stack_fffffffffffffdc4,in_stack_fffffffffffffdc0),
                       in_stack_fffffffffffffdb8);
    std::__cxx11::string::~string(local_e0);
    std::allocator<char>::~allocator(&local_e1);
    if ((bVar2 & 1) != 0) {
      std::__shared_ptr_access<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1a97f5);
      peVar5 = std::
               __shared_ptr_access<pbrt::syntactic::Film,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<pbrt::syntactic::Film,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1a9801);
      in_stack_fffffffffffffdd8 = (vec2i *)&(peVar5->super_Node).super_ParamSet;
      in_stack_fffffffffffffde0 = &local_129;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_01,(char *)CONCAT17(bVar2,in_stack_fffffffffffffde8),in_stack_fffffffffffffde0
                );
      syntactic::ParamSet::getParamString
                (in_stack_fffffffffffffeb8,(string *)in_stack_fffffffffffffeb0);
      std::__cxx11::string::operator=(local_b8,local_108);
      std::__cxx11::string::~string(local_108);
      std::__cxx11::string::~string(local_128);
      std::allocator<char>::~allocator(&local_129);
    }
    std::__shared_ptr_access<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1a9a3a);
    std::__shared_ptr_access<pbrt::syntactic::Film,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<pbrt::syntactic::Film,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1a9a46);
    name = (string *)&local_161;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_01,(char *)CONCAT17(bVar2,in_stack_fffffffffffffde8),in_stack_fffffffffffffde0);
    syntactic::ParamSet::findParam<int>((ParamSet *)in_stack_fffffffffffffdd8,name);
    std::
    __shared_ptr_access<pbrt::syntactic::ParamArray<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<pbrt::syntactic::ParamArray<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1a9aa5);
    local_94 = syntactic::ParamArray<int>::get
                         (in_stack_fffffffffffffdb0,
                          CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    std::shared_ptr<pbrt::syntactic::ParamArray<int>_>::~shared_ptr
              ((shared_ptr<pbrt::syntactic::ParamArray<int>_> *)0x1a9acf);
    std::__cxx11::string::~string(local_160);
    std::allocator<char>::~allocator(&local_161);
    std::__shared_ptr_access<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<pbrt::syntactic::Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1a9af6);
    peVar5 = std::
             __shared_ptr_access<pbrt::syntactic::Film,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<pbrt::syntactic::Film,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1a9b02);
    this_00 = (ParamArray<int> *)&(peVar5->super_Node).super_ParamSet;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_01,(char *)CONCAT17(bVar2,in_stack_fffffffffffffde8),in_stack_fffffffffffffde0);
    syntactic::ParamSet::findParam<int>((ParamSet *)in_stack_fffffffffffffdd8,name);
    std::
    __shared_ptr_access<pbrt::syntactic::ParamArray<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<pbrt::syntactic::ParamArray<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1a9b61);
    iVar3 = syntactic::ParamArray<int>::get
                      (this_00,CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    local_90 = iVar3;
    std::shared_ptr<pbrt::syntactic::ParamArray<int>_>::~shared_ptr
              ((shared_ptr<pbrt::syntactic::ParamArray<int>_> *)0x1a9b8b);
    std::__cxx11::string::~string(local_198);
    std::allocator<char>::~allocator(&local_199);
    std::make_shared<pbrt::Film,pbrt::math::vec2i&,std::__cxx11::string&>
              (in_stack_fffffffffffffdd8,name);
    std::__shared_ptr_access<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<pbrt::Scene,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1a9bd1);
    std::shared_ptr<pbrt::Film>::operator=
              ((shared_ptr<pbrt::Film> *)this_00,
               (shared_ptr<pbrt::Film> *)CONCAT44(iVar3,in_stack_fffffffffffffda8));
    std::shared_ptr<pbrt::Film>::~shared_ptr((shared_ptr<pbrt::Film> *)0x1a9bf2);
    std::__cxx11::string::~string(local_b8);
  }
  return;
}

Assistant:

void createFilm(Scene::SP ours, pbrt::syntactic::Scene::SP pbrt)
  {
    if (pbrt->film &&
        pbrt->film->findParam<int>("xresolution") &&
        pbrt->film->findParam<int>("yresolution")) {
      vec2i resolution;
      std::string fileName = "";
      if (pbrt->film->hasParamString("filename"))
        fileName = pbrt->film->getParamString("filename");
        
      resolution.x = pbrt->film->findParam<int>("xresolution")->get(0);
      resolution.y = pbrt->film->findParam<int>("yresolution")->get(0);
      ours->film = std::make_shared<Film>(resolution,fileName);
    } else {
      std::cout << "warning: could not determine film resolution from pbrt scene" << std::endl;
    }
  }